

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O1

void Cmd_bench(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  
  bVar1 = vid_fps.Value;
  printstats = 1;
  if (vid_fps.Value) {
    if (ConsoleState != c_up) goto LAB_00375839;
  }
  else {
    FBaseCVar::SetGenericRep(&vid_fps.super_FBaseCVar,(UCVarValue)0x1,CVAR_Bool);
  }
  waitstart = I_MSTime();
LAB_00375839:
  switchfps = !bVar1;
  C_HideConsole();
  return;
}

Assistant:

CCMD(bench)
{
	printstats = true;
	if (vid_fps == 0) 
	{
		vid_fps = 1;
		waitstart = I_MSTime();
		switchfps = true;
	}
	else
	{
		if (ConsoleState == c_up) waitstart = I_MSTime();
		switchfps = false;
	}
	C_HideConsole ();
}